

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<crnlib::find_files::file_desc>::~vector(vector<crnlib::find_files::file_desc> *this)

{
  if (this->m_p != (file_desc *)0x0) {
    helpers::destruct_array<crnlib::find_files::file_desc>(this->m_p,this->m_size);
    crnlib_free(this->m_p);
  }
  return;
}

Assistant:

inline ~vector()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
            }
        }